

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::AddPathSuffix(cmFindCommon *this,string *arg)

{
  string suffix;
  string local_38 [32];
  
  std::__cxx11::string::string((string *)&suffix,(string *)arg);
  if (suffix._M_string_length != 0) {
    if (*suffix._M_dataplus._M_p == '/') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&suffix);
      std::__cxx11::string::operator=((string *)&suffix,local_38);
      std::__cxx11::string::~string(local_38);
      if (suffix._M_string_length == 0) goto LAB_00411def;
    }
    if (suffix._M_dataplus._M_p[suffix._M_string_length - 1] == '/') {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&suffix);
      std::__cxx11::string::operator=((string *)&suffix,local_38);
      std::__cxx11::string::~string(local_38);
      if (suffix._M_string_length == 0) goto LAB_00411def;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->SearchPathSuffixes,&suffix);
  }
LAB_00411def:
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void cmFindCommon::AddPathSuffix(std::string const& arg)
{
  std::string suffix = arg;

  // Strip leading and trailing slashes.
  if (suffix.empty()) {
    return;
  }
  if (suffix[0] == '/') {
    suffix = suffix.substr(1);
  }
  if (suffix.empty()) {
    return;
  }
  if (suffix[suffix.size() - 1] == '/') {
    suffix = suffix.substr(0, suffix.size() - 1);
  }
  if (suffix.empty()) {
    return;
  }

  // Store the suffix.
  this->SearchPathSuffixes.push_back(suffix);
}